

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

int lest::version(ostream *os)

{
  ostream *poVar1;
  string local_30 [32];
  ostream *local_10;
  ostream *os_local;
  
  local_10 = os;
  poVar1 = std::operator<<(os,"lest version ");
  poVar1 = std::operator<<(poVar1,"1.35.2");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Compiled with ");
  compiler_abi_cxx11_();
  poVar1 = std::operator<<(poVar1,local_30);
  poVar1 = std::operator<<(poVar1," on ");
  poVar1 = std::operator<<(poVar1,"Apr 26 2025");
  poVar1 = std::operator<<(poVar1," at ");
  poVar1 = std::operator<<(poVar1,"18:43:59");
  poVar1 = std::operator<<(poVar1,".\n");
  std::operator<<(poVar1,"For more information, see https://github.com/martinmoene/lest.\n");
  std::__cxx11::string::~string(local_30);
  return 0;
}

Assistant:

inline int version( std::ostream & os )
{
    os << "lest version "  << lest_VERSION << "\n"
       << "Compiled with " << compiler()   << " on " << __DATE__ << " at " << __TIME__ << ".\n"
       << "For more information, see https://github.com/martinmoene/lest.\n";
    return 0;
}